

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar;
  Type in_stack_0000011c;
  TestPartResultArray *in_stack_00000120;
  char *in_stack_00000128;
  char *in_stack_00000130;
  char *in_stack_00000138;
  string *in_stack_00000150;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  Type in_stack_ffffffffffffffec;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffff0;
  
  HasOneFailure(in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120,
                in_stack_0000011c,in_stack_00000150);
  bVar1 = AssertionResult::operator_cast_to_bool((AssertionResult *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    Message::Message((Message *)in_stack_fffffffffffffff0._M_head_impl);
    this_00 = (AssertHelper *)AssertionResult::failure_message((AssertionResult *)0x174df7);
    AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffff0._M_head_impl,in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_RDI);
    AssertHelper::operator=
              ((AssertHelper *)this,
               (Message *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    AssertHelper::~AssertHelper(this_00);
    Message::~Message((Message *)0x174e45);
  }
  AssertionResult::~AssertionResult((AssertionResult *)0x174e4f);
  std::__cxx11::string::~string((string *)(in_RDI + 0x10));
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}